

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_convert(uchar *out,uchar *in,LodePNGColorMode *mode_out,LodePNGColorMode *mode_in,
                    uint w,uint h)

{
  int iVar1;
  size_t sVar2;
  uchar local_10c;
  uchar local_10b;
  uchar local_10a;
  uchar local_109;
  unsigned_short local_108;
  unsigned_short local_106;
  uchar a_1;
  uchar b_1;
  uchar g_1;
  uchar r_1;
  unsigned_short a;
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  uchar *p;
  size_t palsize;
  uchar *palette;
  size_t palettesize;
  size_t numbytes;
  ulong uStack_d0;
  uint error;
  size_t numpixels;
  ColorTree tree;
  size_t i;
  uint h_local;
  uint w_local;
  LodePNGColorMode *mode_in_local;
  LodePNGColorMode *mode_out_local;
  uchar *in_local;
  uchar *out_local;
  
  uStack_d0 = (ulong)(w * h);
  numbytes._4_4_ = 0;
  iVar1 = lodepng_color_mode_equal(mode_out,mode_in);
  if (iVar1 == 0) {
    if (mode_out->colortype == LCT_PALETTE) {
      palette = (uchar *)mode_out->palettesize;
      palsize = (size_t)mode_out->palette;
      p = (uchar *)(ulong)(uint)(1 << ((byte)mode_out->bitdepth & 0x1f));
      if (palette == (uchar *)0x0) {
        palette = (uchar *)mode_in->palettesize;
        palsize = (size_t)mode_in->palette;
      }
      if (palette < p) {
        p = palette;
      }
      color_tree_init((ColorTree *)&numpixels);
      tree.index = 0;
      tree._132_4_ = 0;
      for (; (uchar *)tree._128_8_ != p; tree._128_8_ = tree._128_8_ + 1) {
        _a = (uchar *)(palsize + tree._128_8_ * 4);
        color_tree_add((ColorTree *)&numpixels,*_a,_a[1],_a[2],_a[3],tree.index);
      }
    }
    if ((mode_in->bitdepth == 0x10) && (mode_out->bitdepth == 0x10)) {
      tree.index = 0;
      tree._132_4_ = 0;
      for (; tree._128_8_ != uStack_d0; tree._128_8_ = tree._128_8_ + 1) {
        _g_1 = 0;
        _a_1 = 0;
        local_106 = 0;
        local_108 = 0;
        getPixelColorRGBA16((unsigned_short *)&g_1,(unsigned_short *)&a_1,&local_106,&local_108,in,
                            tree._128_8_,mode_in);
        rgba16ToPixel(out,tree._128_8_,mode_out,_g_1,_a_1,local_106,local_108);
      }
    }
    else if ((mode_out->bitdepth == 8) && (mode_out->colortype == LCT_RGBA)) {
      getPixelColorsRGBA8(out,uStack_d0,1,in,mode_in);
    }
    else if ((mode_out->bitdepth == 8) && (mode_out->colortype == LCT_RGB)) {
      getPixelColorsRGBA8(out,uStack_d0,0,in,mode_in);
    }
    else {
      local_109 = '\0';
      local_10a = '\0';
      local_10b = '\0';
      local_10c = '\0';
      tree.index = 0;
      tree._132_4_ = 0;
      for (; tree._128_8_ != uStack_d0; tree._128_8_ = tree._128_8_ + 1) {
        getPixelColorRGBA8(&local_109,&local_10a,&local_10b,&local_10c,in,tree._128_8_,mode_in);
        numbytes._4_4_ =
             rgba8ToPixel(out,tree._128_8_,mode_out,(ColorTree *)&numpixels,local_109,local_10a,
                          local_10b,local_10c);
        if (numbytes._4_4_ != 0) break;
      }
    }
    if (mode_out->colortype == LCT_PALETTE) {
      color_tree_cleanup((ColorTree *)&numpixels);
    }
    out_local._4_4_ = numbytes._4_4_;
  }
  else {
    sVar2 = lodepng_get_raw_size(w,h,mode_in);
    tree.index = 0;
    tree._132_4_ = 0;
    for (; tree._128_8_ != sVar2; tree._128_8_ = tree._128_8_ + 1) {
      out[tree._128_8_] = in[tree._128_8_];
    }
    out_local._4_4_ = 0;
  }
  return out_local._4_4_;
}

Assistant:

unsigned lodepng_convert(unsigned char* out, const unsigned char* in,
                         const LodePNGColorMode* mode_out, const LodePNGColorMode* mode_in,
                         unsigned w, unsigned h)
{
  size_t i;
  ColorTree tree;
  size_t numpixels = w * h;
  unsigned error = 0;

  if(lodepng_color_mode_equal(mode_out, mode_in))
  {
    size_t numbytes = lodepng_get_raw_size(w, h, mode_in);
    for(i = 0; i != numbytes; ++i) out[i] = in[i];
    return 0;
  }

  if(mode_out->colortype == LCT_PALETTE)
  {
    size_t palettesize = mode_out->palettesize;
    const unsigned char* palette = mode_out->palette;
    size_t palsize = 1u << mode_out->bitdepth;
    /*if the user specified output palette but did not give the values, assume
    they want the values of the input color type (assuming that one is palette).
    Note that we never create a new palette ourselves.*/
    if(palettesize == 0)
    {
      palettesize = mode_in->palettesize;
      palette = mode_in->palette;
    }
    if(palettesize < palsize) palsize = palettesize;
    color_tree_init(&tree);
    for(i = 0; i != palsize; ++i)
    {
      const unsigned char* p = &palette[i * 4];
      color_tree_add(&tree, p[0], p[1], p[2], p[3], i);
    }
  }

  if(mode_in->bitdepth == 16 && mode_out->bitdepth == 16)
  {
    for(i = 0; i != numpixels; ++i)
    {
      unsigned short r = 0, g = 0, b = 0, a = 0;
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
      rgba16ToPixel(out, i, mode_out, r, g, b, a);
    }
  }
  else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGBA)
  {
    getPixelColorsRGBA8(out, numpixels, 1, in, mode_in);
  }
  else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGB)
  {
    getPixelColorsRGBA8(out, numpixels, 0, in, mode_in);
  }
  else
  {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);
      error = rgba8ToPixel(out, i, mode_out, &tree, r, g, b, a);
      if (error) break;
    }
  }

  if(mode_out->colortype == LCT_PALETTE)
  {
    color_tree_cleanup(&tree);
  }

  return error;
}